

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

bool __thiscall Parse::SMTLIB2::parseAsBuiltinTermSymbol(SMTLIB2 *this,string *id,LExpr *exp)

{
  Stack<Parse::SMTLIB2::ParseResult> *pSVar1;
  ParseResult **ppPVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  Signature *pSVar6;
  TermSymbol ts;
  Interpretation IVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_8_2_43a9448f_for_ParseResult_3 arg2;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar10;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar11;
  TermList TVar12;
  OperatorType *pOVar13;
  Formula *pFVar14;
  Literal *pLVar15;
  Term *pTVar16;
  TermList TVar17;
  ParseResult *pPVar18;
  undefined8 *puVar19;
  anon_union_8_2_43a9448f_for_ParseResult_3 *paVar20;
  Formula *pFVar21;
  TermList in_R8;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar22;
  void **head;
  bool bVar23;
  ParseResult res;
  TermList arraySortIdx;
  TermList args [3];
  anon_union_8_2_43a9448f_for_ParseResult_3 local_3e8;
  char local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_3b8;
  LExpr *local_3b0;
  undefined1 local_3a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_378;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_370;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_368;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_360;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_358;
  Stack<Parse::SMTLIB2::ParseResult> *local_348;
  uint64_t local_340;
  bool local_338;
  char *local_330;
  size_type local_328;
  char local_320;
  undefined7 uStack_31f;
  undefined8 uStack_318;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_310;
  uint64_t local_308;
  bool local_300;
  char *local_2f8;
  size_type local_2f0;
  char local_2e8;
  undefined7 uStack_2e7;
  undefined8 uStack_2e0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2d8;
  uint64_t local_2d0;
  bool local_2c8;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0;
  undefined7 uStack_2af;
  undefined8 uStack_2a8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2a0;
  uint64_t local_298;
  bool local_290;
  char *local_288;
  size_type local_280;
  char local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_268;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_260;
  bool local_258;
  char *local_250;
  size_type local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_230;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_228;
  bool local_220;
  char *local_218;
  size_type local_210;
  char local_208;
  undefined7 uStack_207;
  undefined8 uStack_200;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1f8;
  uint64_t local_1f0;
  bool local_1e8;
  char *local_1e0;
  size_type local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1c0;
  uint64_t local_1b8;
  bool local_1b0;
  char *local_1a8;
  size_type local_1a0;
  char local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_188;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_180;
  bool local_178;
  char *local_170;
  size_type local_168;
  char local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_150;
  uint64_t local_148;
  bool local_140;
  char *local_138;
  size_type local_130;
  char local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_118;
  uint64_t local_110;
  bool local_108;
  char *local_100;
  size_type local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_e0;
  uint64_t local_d8;
  bool local_d0;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_a8;
  uint64_t local_a0;
  bool local_98;
  Formula *local_90;
  undefined8 local_88;
  Formula local_80;
  Formula *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  _Alloc_hider _Stack_40;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_38;
  
  ts = getBuiltInTermSymbol(id);
  bVar23 = false;
  local_3b0 = exp;
  switch(ts) {
  case TS_MULTIPLY:
  case TS_PLUS:
  case TS_MINUS:
  case TS_DIVIDE:
  case TS_DIV:
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3e0 = pPVar18[-1].formula;
    local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if (local_3d8 == paVar9) {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3d8 = &local_3c8;
    }
    else {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3d0 = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.trm._content;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    aVar22 = local_3b8;
    aVar10 = local_3e8;
    if (local_3e0 == '\x01') {
      aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
      aVar10.trm = Kernel::AtomicSort::boolSort();
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    local_348 = &this->_results;
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      if (ts != TS_MINUS) {
        local_3e8.frm = (Formula *)&local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
        complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
      }
      IVar7 = getUnaryMinusInterpretation(this,aVar10.trm);
      pSVar6 = DAT_00b7e1b0;
      pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(IVar7);
      uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,IVar7,pOVar13);
      local_1f8.frm = (Formula *)Kernel::Term::create1(uVar8,aVar22.trm);
      local_220 = false;
      local_210 = 0;
      local_208 = '\0';
      local_228 = aVar10;
      local_218 = &local_208;
      if ((this->_results)._cursor == (this->_results)._end) {
        ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(local_348);
      }
      pPVar18 = (this->_results)._cursor;
      pPVar18->formula = local_220;
      (pPVar18->sort)._content = (uint64_t)local_228;
      paVar9 = &(pPVar18->label).field_2;
      (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
      if (local_218 == &local_208) {
        paVar9->_M_allocated_capacity = CONCAT71(uStack_207,local_208);
        *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_200;
      }
      else {
        (pPVar18->label)._M_dataplus._M_p = local_218;
        (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_207,local_208);
      }
      (pPVar18->label)._M_string_length = local_210;
      local_e0 = local_1f8;
    }
    else {
      IVar7 = getTermSymbolInterpretation(this,ts,aVar10.trm);
      pSVar6 = DAT_00b7e1b0;
      pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(IVar7);
      uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,IVar7,pOVar13);
      pPVar18 = (this->_results)._cursor;
      (this->_results)._cursor = pPVar18 + -1;
      local_3e0 = pPVar18[-1].formula;
      local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
      local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pPVar18[-1].label._M_dataplus._M_p;
      paVar9 = &pPVar18[-1].label.field_2;
      if (local_3d8 == paVar9) {
        local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
        local_3d8 = &local_3c8;
      }
      else {
        local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_3d0 = pPVar18[-1].label._M_string_length;
      pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
      pPVar18[-1].label._M_string_length = 0;
      pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
      local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
      pPVar18 = (this->_results)._cursor;
      pcVar3 = (pPVar18->label)._M_dataplus._M_p;
      paVar9 = &(pPVar18->label).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar9) {
        operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
      }
      aVar11 = local_3e8;
      arg2 = local_3b8;
      if (local_3e0 == '\x01') {
        arg2.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar11.trm = Kernel::AtomicSort::boolSort();
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
      }
      if (aVar11.frm != aVar10.frm) {
        local_3e8.frm = (Formula *)&local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
        complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
      }
      while( true ) {
        aVar22.frm = (Formula *)Kernel::Term::create2(uVar8,aVar22.trm,arg2.trm);
        pPVar18 = (this->_results)._cursor;
        if ((pPVar18 == (this->_results)._stack) ||
           ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
            (pPVar18[-1].field_3.frm == (Formula *)0x0)))) break;
        (this->_results)._cursor = pPVar18 + -1;
        local_3e0 = pPVar18[-1].formula;
        local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
        local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pPVar18[-1].label._M_dataplus._M_p;
        paVar9 = &pPVar18[-1].label.field_2;
        if (local_3d8 == paVar9) {
          local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
          local_3d8 = &local_3c8;
        }
        else {
          local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_3d0 = pPVar18[-1].label._M_string_length;
        pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
        pPVar18[-1].label._M_string_length = 0;
        pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
        local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
        pPVar18 = (this->_results)._cursor;
        pcVar3 = (pPVar18->label)._M_dataplus._M_p;
        paVar9 = &(pPVar18->label).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar9) {
          operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
        }
        aVar11 = local_3e8;
        arg2 = local_3b8;
        if (local_3e0 == '\x01') {
          arg2.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
          aVar11.trm = Kernel::AtomicSort::boolSort();
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
        }
        if (aVar11.frm != aVar10.frm) {
          local_3e8.frm = (Formula *)&local_3d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","")
          ;
          complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
        }
      }
      local_258 = false;
      local_248 = 0;
      local_240 = '\0';
      local_260 = aVar10;
      local_250 = &local_240;
      local_230.frm = aVar22.frm;
      if (pPVar18 == (this->_results)._end) {
        ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(local_348);
      }
      pPVar18 = (this->_results)._cursor;
      pPVar18->formula = local_258;
      (pPVar18->sort)._content = (uint64_t)local_260;
      paVar9 = &(pPVar18->label).field_2;
      (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
      if (local_250 == &local_240) {
        paVar9->_M_allocated_capacity = CONCAT71(uStack_23f,local_240);
        *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_238;
      }
      else {
        (pPVar18->label)._M_dataplus._M_p = local_250;
        (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_23f,local_240);
      }
      (pPVar18->label)._M_string_length = local_248;
      local_e0 = local_230;
    }
    break;
  case TS_ARRAY:
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,exp);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3e0 = pPVar18[-1].formula;
    local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if (local_3d8 == paVar9) {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3d8 = &local_3c8;
    }
    else {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3d0 = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    aVar22 = local_3b8;
    if (local_3e0 == '\x01') {
      aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
      Kernel::AtomicSort::boolSort();
    }
    Kernel::AtomicSort::superSort();
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,exp);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3e0 = pPVar18[-1].formula;
    local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if (local_3d8 == paVar9) {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3d8 = &local_3c8;
    }
    else {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3d0 = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    aVar10 = local_3b8;
    if (local_3e0 == '\x01') {
      aVar10.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
      Kernel::AtomicSort::boolSort();
    }
    Kernel::AtomicSort::superSort();
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    TVar12 = Kernel::AtomicSort::superSort();
    local_268.trm = Kernel::AtomicSort::arraySort(aVar22.trm,aVar10.trm);
    local_290 = false;
    local_280 = 0;
    local_278 = '\0';
    local_298 = TVar12._content;
    local_288 = &local_278;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_290;
    (pPVar18->sort)._content = local_298;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_288 == &local_278) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_277,local_278);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_270;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_288;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_277,local_278);
    }
    (pPVar18->label)._M_string_length = local_280;
    local_e0 = local_268;
    break;
  case TS_BOOL:
    TVar12 = Kernel::AtomicSort::superSort();
    local_2a0.trm = Kernel::AtomicSort::boolSort();
    local_2c8 = false;
    local_2b8 = 0;
    local_2b0 = '\0';
    local_2d0 = TVar12._content;
    local_2c0 = &local_2b0;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_2c8;
    (pPVar18->sort)._content = local_2d0;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_2c0 == &local_2b0) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_2af,local_2b0);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_2a8;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_2c0;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_2af,local_2b0);
    }
    (pPVar18->label)._M_string_length = local_2b8;
    local_e0 = local_2a0;
    break;
  case TS_INT:
    TVar12 = Kernel::AtomicSort::superSort();
    local_2d8.trm = Kernel::AtomicSort::intSort();
    local_300 = false;
    local_2f0 = 0;
    local_2e8 = '\0';
    local_308 = TVar12._content;
    local_2f8 = &local_2e8;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_300;
    (pPVar18->sort)._content = local_308;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_2f8 == &local_2e8) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_2e7,local_2e8);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_2e0;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_2f8;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_2e7,local_2e8);
    }
    (pPVar18->label)._M_string_length = local_2f0;
    local_e0 = local_2d8;
    break;
  case TS_REAL:
    TVar12 = Kernel::AtomicSort::superSort();
    local_310.trm = Kernel::AtomicSort::realSort();
    local_338 = false;
    local_328 = 0;
    local_320 = '\0';
    local_340 = TVar12._content;
    local_330 = &local_320;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_338;
    (pPVar18->sort)._content = local_340;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_330 == &local_320) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_31f,local_320);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_318;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_330;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_31f,local_320);
    }
    (pPVar18->label)._M_string_length = local_328;
    local_e0 = local_310;
    break;
  case TS_ABS:
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar22 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,&this->_results);
      aVar22 = local_3b8;
      aVar10 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar10.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::AtomicSort::intSort();
      bVar23 = aVar10.frm != (Formula *)TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    pSVar6 = DAT_00b7e1b0;
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,exp);
    }
    pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(INT_ABS);
    uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,INT_ABS,pOVar13);
    aVar22.frm = (Formula *)Kernel::Term::create1(uVar8,aVar22.trm);
    local_1b8 = (uint64_t)Kernel::AtomicSort::intSort();
    local_1b0 = false;
    local_1a0 = 0;
    local_198 = '\0';
    local_1a8 = &local_198;
    local_188.frm = aVar22.frm;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_1b0;
    (pPVar18->sort)._content = local_1b8;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_1a8 == &local_198) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_197,local_198);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_190;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_1a8;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_197,local_198);
    }
    (pPVar18->label)._M_string_length = local_1a0;
    local_e0 = local_188;
    break;
  case TS_ITE:
    pSVar1 = &this->_results;
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,pSVar1);
      bVar23 = ParseResult::asFormula((ParseResult *)&local_3e8.trm,&local_370.frm);
      bVar23 = !bVar23;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,exp);
    }
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,local_3b0);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3a8[8] = pPVar18[-1].formula;
    local_3a8._0_8_ = pPVar18[-1].sort._content;
    local_3a8._16_8_ = pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._16_8_ == paVar9) {
      local_388._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_388._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3a8._16_8_ = &local_388;
    }
    else {
      local_388._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3a8._24_8_ = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_378 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    aVar22 = local_378;
    TVar12._content = local_3a8._0_8_;
    if (local_3a8[8] == true) {
      aVar22.frm = (Formula *)Kernel::Term::createFormula(local_378.frm);
      TVar12 = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._16_8_ != &local_388) {
      operator_delete((void *)local_3a8._16_8_,local_388._M_allocated_capacity + 1);
    }
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar10 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)local_3a8,pSVar1);
      TVar17._content = local_3a8._0_8_;
      aVar10 = local_378;
      if (local_3a8[8] == true) {
        aVar10.frm = (Formula *)Kernel::Term::createFormula(local_378.frm);
        TVar17 = Kernel::AtomicSort::boolSort();
      }
      bVar23 = TVar17._content != TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._16_8_ != &local_388)) {
      operator_delete((void *)local_3a8._16_8_,local_388._M_allocated_capacity + 1);
    }
    if (bVar23) {
      local_368.frm = (Formula *)&local_358;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_368.trm,local_3b0);
    }
    local_a8.frm = (Formula *)Kernel::Term::createITE(local_370.frm,aVar22.trm,aVar10.trm,TVar12);
    local_d0 = false;
    local_c0 = 0;
    local_b8 = '\0';
    local_d8 = TVar12._content;
    local_c8 = &local_b8;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_d0;
    (pPVar18->sort)._content = local_d8;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_c8 == &local_b8) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_b0;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_c8;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
    }
    (pPVar18->label)._M_string_length = local_c0;
    local_e0 = local_a8;
    break;
  default:
    goto switchD_0064d2cf_caseD_b;
  case TS_MOD:
    pSVar1 = &this->_results;
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar22 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
      aVar10 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
      bVar5 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,pSVar1);
      aVar10 = local_3b8;
      aVar11 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar10.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar11.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::AtomicSort::intSort();
      bVar5 = true;
      if (((aVar11.frm == (Formula *)TVar12._content) &&
          (pPVar18 = (this->_results)._cursor, pPVar18 != (this->_results)._stack)) &&
         (((~(uint)pPVar18[-1].sort._content & 3) != 0 ||
          ((pPVar18[-1].formula != true || (pPVar18[-1].field_3.frm != (Formula *)0x0)))))) {
        ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)local_3a8,pSVar1);
        aVar22 = local_378;
        TVar12._content = local_3a8._0_8_;
        if (local_3a8[8] == true) {
          aVar22.frm = (Formula *)Kernel::Term::createFormula(local_378.frm);
          TVar12 = Kernel::AtomicSort::boolSort();
        }
        TVar17 = Kernel::AtomicSort::intSort();
        bVar23 = TVar12._content != TVar17._content;
        bVar4 = true;
        bVar5 = true;
      }
      else {
        bVar4 = false;
        bVar23 = true;
      }
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._16_8_ != &local_388)) {
      operator_delete((void *)local_3a8._16_8_,local_388._M_allocated_capacity + 1);
    }
    if ((bVar5) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    pSVar6 = DAT_00b7e1b0;
    if (bVar23) {
      local_368.frm = (Formula *)&local_358;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_368.trm,local_3b0);
    }
    pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(INT_REMAINDER_E);
    uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,INT_REMAINDER_E,pOVar13);
    aVar22.frm = (Formula *)Kernel::Term::create2(uVar8,aVar10.trm,aVar22.trm);
    local_1f0 = (uint64_t)Kernel::AtomicSort::intSort();
    local_1e8 = false;
    local_1d8 = 0;
    local_1d0 = '\0';
    local_1e0 = &local_1d0;
    local_1c0.frm = aVar22.frm;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_1e8;
    (pPVar18->sort)._content = local_1f0;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_1e0 == &local_1d0) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_1cf,local_1d0);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_1c8;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_1e0;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_1cf,local_1d0);
    }
    (pPVar18->label)._M_string_length = local_1d8;
    local_e0 = local_1c0;
    break;
  case TS_SELECT:
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3e0 = pPVar18[-1].formula;
    local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if (local_3d8 == paVar9) {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3d8 = &local_3c8;
    }
    else {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3d0 = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    local_368 = local_3e8;
    aVar22 = local_3b8;
    if (local_3e0 == '\x01') {
      aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
      local_368.trm = Kernel::AtomicSort::boolSort();
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    bVar23 = Kernel::TermList::isArraySort(&local_368.trm);
    if (!bVar23) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
    }
    pSVar1 = &this->_results;
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar10 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,pSVar1);
      aVar10 = local_3b8;
      aVar11 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar10.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar11.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::SortHelper::getIndexSort(local_368.trm);
      bVar23 = aVar11.frm != (Formula *)TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,local_3b0);
    }
    TVar12 = Kernel::SortHelper::getInnerSort(local_368.trm);
    TVar17 = Kernel::AtomicSort::boolSort();
    if (TVar12._content == TVar17._content) {
      pOVar13 = Kernel::Theory::getArrayOperatorType(local_368.trm,ARRAY_BOOL_SELECT);
      uVar8 = Kernel::Signature::getInterpretingSymbol(DAT_00b7e1b0,ARRAY_BOOL_SELECT,pOVar13);
      pFVar14 = (Formula *)
                ::Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                          );
      pLVar15 = Kernel::Literal::create2
                          ((Literal *)(ulong)uVar8,1,SUB81(aVar22.trm._content,0),aVar10.trm,in_R8);
      pFVar14->_connective = LITERAL;
      (pFVar14->_label)._M_dataplus._M_p = (pointer)&(pFVar14->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar14->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(pFVar14 + 1) = pLVar15;
      local_80._label.field_2._M_allocated_capacity = (size_type)Kernel::AtomicSort::boolSort();
      pFVar21 = (Formula *)&local_48;
      local_80._label.field_2._M_local_buf[8] = true;
      local_58 = pFVar21;
      local_50 = 0;
      local_48 = LITERAL;
      local_38.frm = pFVar14;
      if ((this->_results)._cursor == (this->_results)._end) {
        ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
      }
      pPVar18 = (this->_results)._cursor;
      pPVar18->formula = (bool)local_80._label.field_2._M_local_buf[8];
      (pPVar18->sort)._content = local_80._label.field_2._M_allocated_capacity;
      paVar9 = &(pPVar18->label).field_2;
      (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
      if (local_58 == pFVar21) {
        paVar9->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
        *(pointer *)((long)&(pPVar18->label).field_2 + 8) = _Stack_40._M_p;
      }
      else {
        (pPVar18->label)._M_dataplus._M_p = (pointer)local_58;
        (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
      }
      puVar19 = &local_50;
      paVar20 = &local_38;
    }
    else {
      pOVar13 = Kernel::Theory::getArrayOperatorType(local_368.trm,ARRAY_SELECT);
      uVar8 = Kernel::Signature::getInterpretingSymbol(DAT_00b7e1b0,ARRAY_SELECT,pOVar13);
      pTVar16 = Kernel::Term::create2(uVar8,aVar22.trm,aVar10.trm);
      local_a0 = (uint64_t)Kernel::SortHelper::getInnerSort(local_368.trm);
      pFVar21 = &local_80;
      local_98 = false;
      local_88 = 0;
      local_80._connective._0_1_ = LITERAL;
      local_80._label._M_string_length = (size_type)pTVar16;
      local_90 = pFVar21;
      if ((this->_results)._cursor == (this->_results)._end) {
        ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
      }
      pPVar18 = (this->_results)._cursor;
      pPVar18->formula = local_98;
      (pPVar18->sort)._content = local_a0;
      paVar9 = &(pPVar18->label).field_2;
      (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
      if (local_90 == pFVar21) {
        paVar9->_M_allocated_capacity = CONCAT71(local_80._1_7_,(undefined1)local_80._connective);
        *(pointer *)((long)&(pPVar18->label).field_2 + 8) = local_80._label._M_dataplus._M_p;
      }
      else {
        (pPVar18->label)._M_dataplus._M_p = (pointer)local_90;
        (pPVar18->label).field_2._M_allocated_capacity =
             CONCAT71(local_80._1_7_,(undefined1)local_80._connective);
      }
      puVar19 = &local_88;
      paVar20 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)&local_80._label._M_string_length;
    }
    (pPVar18->label)._M_string_length = (size_type)paVar20[-3];
    paVar20[-4].frm = pFVar21;
    *puVar19 = 0;
    *(undefined1 *)&pFVar21->_connective = LITERAL;
    local_e0 = *paVar20;
    break;
  case TS_STORE:
    pPVar18 = (this->_results)._cursor;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
    }
    (this->_results)._cursor = pPVar18 + -1;
    local_3e0 = pPVar18[-1].formula;
    local_3e8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].sort._content;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pPVar18[-1].label._M_dataplus._M_p;
    paVar9 = &pPVar18[-1].label.field_2;
    if (local_3d8 == paVar9) {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_3c8._8_8_ = *(undefined8 *)((long)&pPVar18[-1].label.field_2 + 8);
      local_3d8 = &local_3c8;
    }
    else {
      local_3c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_3d0 = pPVar18[-1].label._M_string_length;
    pPVar18[-1].label._M_dataplus._M_p = (pointer)paVar9;
    pPVar18[-1].label._M_string_length = 0;
    pPVar18[-1].label.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar18[-1].field_3.frm;
    pPVar18 = (this->_results)._cursor;
    pcVar3 = (pPVar18->label)._M_dataplus._M_p;
    paVar9 = &(pPVar18->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar9) {
      operator_delete(pcVar3,paVar9->_M_allocated_capacity + 1);
    }
    local_370 = local_3e8;
    aVar22 = local_3b8;
    if (local_3e0 == '\x01') {
      aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
      local_370.trm = Kernel::AtomicSort::boolSort();
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    bVar23 = Kernel::TermList::isArraySort(&local_370.trm);
    if (!bVar23) {
      local_3e8.frm = (Formula *)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3e8.trm,local_3b0);
    }
    pSVar1 = &this->_results;
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar10 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,pSVar1);
      aVar10 = local_3b8;
      aVar11 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar10.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar11.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::SortHelper::getIndexSort(local_370.trm);
      bVar23 = aVar11.frm != (Formula *)TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,local_3b0);
    }
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar11 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)local_3a8,pSVar1);
      aVar11 = local_378;
      TVar12._content = local_3a8._0_8_;
      if (local_3a8[8] == true) {
        aVar11.frm = (Formula *)Kernel::Term::createFormula(local_378.frm);
        TVar12 = Kernel::AtomicSort::boolSort();
      }
      TVar17 = Kernel::SortHelper::getInnerSort(local_370.trm);
      bVar23 = TVar12._content != TVar17._content;
      bVar4 = true;
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._16_8_ != &local_388)) {
      operator_delete((void *)local_3a8._16_8_,local_388._M_allocated_capacity + 1);
    }
    if (bVar23) {
      local_368.frm = (Formula *)&local_358;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_368.trm,local_3b0);
    }
    pOVar13 = Kernel::Theory::getArrayOperatorType(local_370.trm,ARRAY_STORE);
    uVar8 = Kernel::Signature::getInterpretingSymbol(DAT_00b7e1b0,ARRAY_STORE,pOVar13);
    local_368 = aVar22;
    local_360 = aVar10;
    local_358 = aVar11;
    local_150.frm = (Formula *)Kernel::Term::create(uVar8,3,&local_368.trm);
    local_180.frm = local_370.frm;
    local_178 = false;
    local_168 = 0;
    local_160 = '\0';
    local_170 = &local_160;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_178;
    (pPVar18->sort)._content = (uint64_t)local_180;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_170 == &local_160) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_15f,local_160);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_158;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_170;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_15f,local_160);
    }
    (pPVar18->label)._M_string_length = local_168;
    local_e0 = local_150;
    break;
  case TS_TO_INT:
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar22 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,&this->_results);
      aVar22 = local_3b8;
      aVar10 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar10.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::AtomicSort::realSort();
      bVar23 = aVar10.frm != (Formula *)TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    pSVar6 = DAT_00b7e1b0;
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,exp);
    }
    pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(REAL_TO_INT);
    uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,REAL_TO_INT,pOVar13);
    aVar22.frm = (Formula *)Kernel::Term::create1(uVar8,aVar22.trm);
    local_148 = (uint64_t)Kernel::AtomicSort::intSort();
    local_140 = false;
    local_130 = 0;
    local_128 = '\0';
    local_138 = &local_128;
    local_118.frm = aVar22.frm;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_140;
    (pPVar18->sort)._content = local_148;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_138 == &local_128) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_127,local_128);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_120;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_138;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_127,local_128);
    }
    (pPVar18->label)._M_string_length = local_130;
    local_e0 = local_118;
    break;
  case TS_TO_REAL:
    pPVar18 = (this->_results)._cursor;
    bVar23 = true;
    aVar22 = (anon_union_8_2_43a9448f_for_ParseResult_3)0x2;
    if ((pPVar18 == (this->_results)._stack) ||
       ((((~(uint)pPVar18[-1].sort._content & 3) == 0 && (pPVar18[-1].formula == true)) &&
        (pPVar18[-1].field_3.frm == (Formula *)0x0)))) {
      bVar4 = false;
    }
    else {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3e8.trm,&this->_results);
      aVar22 = local_3b8;
      aVar10 = local_3e8;
      if (local_3e0 == '\x01') {
        aVar22.frm = (Formula *)Kernel::Term::createFormula(local_3b8.frm);
        aVar10.trm = Kernel::AtomicSort::boolSort();
      }
      TVar12 = Kernel::AtomicSort::intSort();
      bVar23 = aVar10.frm != (Formula *)TVar12._content;
      bVar4 = true;
    }
    if ((bVar4) && (local_3d8 != &local_3c8)) {
      operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    pSVar6 = DAT_00b7e1b0;
    if (bVar23) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)local_3a8,exp);
    }
    pOVar13 = Kernel::Theory::getNonpolymorphicOperatorType(INT_TO_REAL);
    uVar8 = Kernel::Signature::getInterpretingSymbol(pSVar6,INT_TO_REAL,pOVar13);
    aVar22.frm = (Formula *)Kernel::Term::create1(uVar8,aVar22.trm);
    local_110 = (uint64_t)Kernel::AtomicSort::realSort();
    local_108 = false;
    local_f8 = 0;
    local_f0 = '\0';
    local_100 = &local_f0;
    local_e0.frm = aVar22.frm;
    if ((this->_results)._cursor == (this->_results)._end) {
      ::Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
    }
    pPVar18 = (this->_results)._cursor;
    pPVar18->formula = local_108;
    (pPVar18->sort)._content = local_110;
    paVar9 = &(pPVar18->label).field_2;
    (pPVar18->label)._M_dataplus._M_p = (pointer)paVar9;
    if (local_100 == &local_f0) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)((long)&(pPVar18->label).field_2 + 8) = uStack_e8;
    }
    else {
      (pPVar18->label)._M_dataplus._M_p = local_100;
      (pPVar18->label).field_2._M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
    }
    (pPVar18->label)._M_string_length = local_f8;
  }
  (pPVar18->field_3).frm = (Formula *)local_e0;
  ppPVar2 = &(this->_results)._cursor;
  *ppPVar2 = *ppPVar2 + 1;
  bVar23 = true;
switchD_0064d2cf_caseD_b:
  return bVar23;
}

Assistant:

bool SMTLIB2::parseAsBuiltinTermSymbol(const std::string& id, LExpr* exp)
{
  // try built-in term symbols
  TermSymbol ts = getBuiltInTermSymbol(id);
  switch(ts) {
    case TS_ITE:
    {
      Formula* cond;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          !(_results.pop().asFormula(cond))) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList thenBranch;
      if (_results.isEmpty() || _results.top().isSeparator()){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(thenBranch);
      TermList elseBranch;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(elseBranch) != sort){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::createITE(cond, thenBranch, elseBranch, sort));

      _results.push(ParseResult(sort,res));
      return true;
    }
    case TS_TO_REAL:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_TO_REAL);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::realSort(),res));
      return true;
    }
    case TS_TO_INT:
    {
      TermList theReal;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theReal) != AtomicSort::realSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::REAL_TO_INT);
      TermList res = TermList(Term::create1(fun,theReal));

      _results.push(ParseResult(AtomicSort::intSort(),res));
      return true;
    }
    case TS_SELECT:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      if (SortHelper::getInnerSort(arraySortIdx)== AtomicSort::boolSort()) {
        OperatorType* predType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_BOOL_SELECT);
        unsigned pred = env.signature->getInterpretingSymbol(Theory::ARRAY_BOOL_SELECT,predType);

        Formula* res = new AtomicFormula(Literal::create2(pred,true,theArray,theIndex));

        _results.push(ParseResult(res));
      } else {
        OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_SELECT);
        unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_SELECT,funType);

        TermList res = TermList(Term::create2(fun,theArray,theIndex));

        _results.push(ParseResult(SortHelper::getInnerSort(arraySortIdx),res));
      }

      return true;
    }
    case TS_STORE:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theValue;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theValue) != SortHelper::getInnerSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_STORE);
      unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_STORE,funType);

      TermList args[] = {theArray, theIndex, theValue};
      TermList res = TermList(Term::create(fun, 3, args));

      _results.push(ParseResult(arraySortIdx,res));

      return true;
    }
    case TS_ABS:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_ABS);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MOD:
    {
      TermList int1, int2;
      if (_results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int1) != AtomicSort::intSort() ||
          _results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int2) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_REMAINDER_E); // TS_MOD is the always positive remainder, therefore INT_REMAINDER_E
      TermList res = TermList(Term::create2(fun,int1,int2));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MULTIPLY:
    case TS_PLUS:
    case TS_MINUS:
    case TS_DIVIDE:
    case TS_DIV:
    {
      // read the first argument
      TermList first;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(first);

      if (_results.isEmpty() || _results.top().isSeparator()) {
        if (ts == TS_MINUS) { // unary minus
          Interpretation intp = getUnaryMinusInterpretation(sort);
          unsigned fun = env.signature->getInterpretingSymbol(intp);

          TermList res = TermList(Term::create1(fun,first));

          _results.push(ParseResult(sort,res));

          return true;
        } else {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp); // we need at least two arguments otherwise
        }
      }

      Interpretation intp = getTermSymbolInterpretation(ts,sort);
      unsigned fun = env.signature->getInterpretingSymbol(intp);

      TermList second;
      if (_results.pop().asTerm(second) != sort) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::create2(fun,first,second));
      while (_results.isNonEmpty() && !_results.top().isSeparator()) {
        TermList another;
        if (_results.pop().asTerm(another) != sort) {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
        }

        res = TermList(Term::create2(fun,res,another));
      }
      _results.push(ParseResult(sort,res));

      return true;
    }
    case TS_ARRAY:
    {
      TermList indexSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(indexSort) == AtomicSort::superSort());
      TermList innerSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(innerSort) == AtomicSort::superSort());
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::arraySort(indexSort, innerSort)));
      return true;
    }
    case TS_BOOL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::boolSort()));
      return true;
    }
    case TS_INT:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::intSort()));
      return true;
    }
    case TS_REAL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::realSort()));
      return true;
    }
    default:
      ASS_EQ(ts,TS_USER_FUNCTION);
      return false;
  }
}